

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

int lys_get_sibling(lys_node *siblings,char *mod_name,int mod_name_len,char *name,int nam_len,
                   LYS_NODE type,lys_node **ret)

{
  char *__s1;
  int iVar1;
  size_t sVar2;
  lys_node *plVar3;
  lys_module *plVar4;
  bool bVar5;
  char *node_mod_name;
  lys_module *mod;
  lys_node *parent;
  lys_node *node;
  LYS_NODE type_local;
  int nam_len_local;
  char *name_local;
  int mod_name_len_local;
  char *mod_name_local;
  lys_node *siblings_local;
  
  node_mod_name = (char *)0x0;
  if (((siblings == (lys_node *)0x0) || (mod_name == (char *)0x0)) || (name == (char *)0x0)) {
    __assert_fail("siblings && mod_name && name",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                  ,0x94,
                  "int lys_get_sibling(const struct lys_node *, const char *, int, const char *, int, LYS_NODE, const struct lys_node **)"
                 );
  }
  if ((type & (LYS_USES|LYS_GROUPING)) != LYS_UNKNOWN) {
    __assert_fail("!(type & (LYS_USES | LYS_GROUPING))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                  ,0x95,
                  "int lys_get_sibling(const struct lys_node *, const char *, int, const char *, int, LYS_NODE, const struct lys_node **)"
                 );
  }
  name_local._4_4_ = mod_name_len;
  if (mod_name_len == 0) {
    sVar2 = strlen(mod_name);
    name_local._4_4_ = (int)sVar2;
  }
  mod_name_local = (char *)siblings;
  node._4_4_ = nam_len;
  if (nam_len == 0) {
    sVar2 = strlen(name);
    node._4_4_ = (int)sVar2;
  }
  while( true ) {
    bVar5 = false;
    if (mod_name_local != (char *)0x0) {
      bVar5 = *(int *)(mod_name_local + 0x38) == 0x1000;
    }
    if (!bVar5) break;
    mod_name_local = *(char **)(mod_name_local + 0x48);
  }
  if (mod_name_local == (char *)0x0) {
    siblings_local._4_4_ = 1;
  }
  else {
    if (*(int *)(mod_name_local + 0x38) == 0x800) {
      parent = (lys_node *)mod_name_local;
      while( true ) {
        bVar5 = false;
        if (parent->nodetype == LYS_GROUPING) {
          bVar5 = parent->prev != (lys_node *)mod_name_local;
        }
        if (!bVar5) break;
        parent = parent->prev;
      }
      if (parent->nodetype == LYS_GROUPING) {
        return 1;
      }
      mod_name_local = (char *)parent;
    }
    mod = (lys_module *)lys_parent((lys_node *)mod_name_local);
    while( true ) {
      bVar5 = false;
      if (mod != (lys_module *)0x0) {
        bVar5 = *(int *)&mod->filepath == 0x1000;
      }
      if (!bVar5) break;
      mod = (lys_module *)lys_parent((lys_node *)mod);
    }
    if (mod == (lys_module *)0x0) {
      parent = (lys_node *)mod_name_local;
      while( true ) {
        plVar3 = lys_parent(parent);
        bVar5 = false;
        if (plVar3 != (lys_node *)0x0) {
          bVar5 = parent->nodetype == LYS_USES;
        }
        if (!bVar5) break;
        parent = lys_parent(parent);
      }
      node_mod_name = (char *)lys_node_module(parent);
    }
    parent = (lys_node *)0x0;
    do {
      do {
        parent = lys_getnext(parent,(lys_node *)mod,(lys_module *)node_mod_name,0xb);
        if (parent == (lys_node *)0x0) {
          return 1;
        }
      } while ((type != LYS_UNKNOWN) && ((parent->nodetype & type) == LYS_UNKNOWN));
      plVar4 = lys_node_module(parent);
      __s1 = plVar4->name;
    } while (((__s1 != mod_name) &&
             ((iVar1 = strncmp(__s1,mod_name,(long)name_local._4_4_), iVar1 != 0 ||
              (__s1[name_local._4_4_] != '\0')))) ||
            ((parent->name != name &&
             ((iVar1 = strncmp(parent->name,name,(long)node._4_4_), iVar1 != 0 ||
              (parent->name[node._4_4_] != '\0'))))));
    if (ret != (lys_node **)0x0) {
      *ret = parent;
    }
    siblings_local._4_4_ = 0;
  }
  return siblings_local._4_4_;
}

Assistant:

int
lys_get_sibling(const struct lys_node *siblings, const char *mod_name, int mod_name_len, const char *name,
                int nam_len, LYS_NODE type, const struct lys_node **ret)
{
    const struct lys_node *node, *parent = NULL;
    const struct lys_module *mod = NULL;
    const char *node_mod_name;

    assert(siblings && mod_name && name);
    assert(!(type & (LYS_USES | LYS_GROUPING)));

    /* fill the lengths in case the caller is so indifferent */
    if (!mod_name_len) {
        mod_name_len = strlen(mod_name);
    }
    if (!nam_len) {
        nam_len = strlen(name);
    }

    while (siblings && (siblings->nodetype == LYS_USES)) {
        siblings = siblings->child;
    }
    if (!siblings) {
        /* unresolved uses */
        return EXIT_FAILURE;
    }

    if (siblings->nodetype == LYS_GROUPING) {
        for (node = siblings; (node->nodetype == LYS_GROUPING) && (node->prev != siblings); node = node->prev);
        if (node->nodetype == LYS_GROUPING) {
            /* we went through all the siblings, only groupings there - no valid sibling */
            return EXIT_FAILURE;
        }
        /* update siblings to be valid */
        siblings = node;
    }

    /* set parent correctly */
    parent = lys_parent(siblings);

    /* go up all uses */
    while (parent && (parent->nodetype == LYS_USES)) {
        parent = lys_parent(parent);
    }

    if (!parent) {
        /* handle situation when there is a top-level uses referencing a foreign grouping */
        for (node = siblings; lys_parent(node) && (node->nodetype == LYS_USES); node = lys_parent(node));
        mod = lys_node_module(node);
    }

    /* try to find the node */
    node = NULL;
    while ((node = lys_getnext(node, parent, mod, LYS_GETNEXT_WITHCHOICE | LYS_GETNEXT_WITHCASE | LYS_GETNEXT_WITHINOUT))) {
        if (!type || (node->nodetype & type)) {
            /* module name comparison */
            node_mod_name = lys_node_module(node)->name;
            if (!ly_strequal(node_mod_name, mod_name, 1) && (strncmp(node_mod_name, mod_name, mod_name_len) || node_mod_name[mod_name_len])) {
                continue;
            }

            /* direct name check */
            if (ly_strequal(node->name, name, 1) || (!strncmp(node->name, name, nam_len) && !node->name[nam_len])) {
                if (ret) {
                    *ret = node;
                }
                return EXIT_SUCCESS;
            }
        }
    }

    return EXIT_FAILURE;
}